

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall
PeleLM::getViscTerms(PeleLM *this,MultiFab *visc_terms,int src_comp,int num_comp,Real time)

{
  Geometry *this_00;
  pointer pcVar1;
  ostringstream *this_01;
  MultiFab *mf;
  FluxBoxes beta;
  TimeLevel TVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  Periodicity PVar7;
  FluxBoxes fb;
  string local_220;
  Real local_200;
  int local_1f8;
  int local_1f4;
  FluxBoxes local_1f0;
  string local_1e8;
  FabArray<amrex::FArrayBox> *local_1c8;
  double local_1c0;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  local_200 = time;
  local_1c0 = amrex::ParallelDescriptor::second();
  iVar5 = (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
  amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
            (&visc_terms->super_FabArray<amrex::FArrayBox>,1e+30,0,
             (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp);
  if (src_comp < 3) {
    local_1c8 = &visc_terms->super_FabArray<amrex::FArrayBox>;
    if (src_comp != 0 || num_comp < 3) {
      amrex::Error_host("tensor v -> getViscTerms needs all v-components at once");
    }
    local_1f0.data = (MultiFab **)0x0;
    local_1f8 = iVar5;
    local_1f4 = num_comp;
    FluxBoxes::define(&local_1f0,(AmrLevel *)this,1,0);
    beta.data = local_1f0.data;
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x32])(local_200,this);
    pcVar1 = local_1b8 + 0x10;
    lVar4 = 0;
    do {
      local_1b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"velVT","");
      mf = beta.data[lVar4];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"velVT_viscn_","");
      amrex::Concatenate(&local_220,&local_1e8,(int)lVar4,1);
      showMF((string *)local_1b8,mf,&local_220,(this->super_NavierStokesBase).super_AmrLevel.level,
             -1,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1b8._0_8_ != pcVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    TVar2 = amrex::AmrLevel::which_time((AmrLevel *)this,0,local_200);
    visc_terms = (MultiFab *)local_1c8;
    Diffusion::getTensorViscTerms
              ((this->super_NavierStokesBase).diffusion,(MultiFab *)local_1c8,local_200,beta.data,
               (&(this->super_NavierStokesBase).viscn_cc)[TVar2 != AmrOldTime],0);
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"velVT","");
    num_comp = local_1f4;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"velVT_visc_terms_1","");
    showMF((string *)local_1b8,visc_terms,&local_220,
           (this->super_NavierStokesBase).super_AmrLevel.level,-1,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    iVar5 = local_1f8;
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    FluxBoxes::clear(&local_1f0);
  }
  else {
    amrex::Abort_host("Should only call getViscTerms for velocity");
  }
  if (0 < iVar5) {
    this_00 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    PVar7 = amrex::Geometry::periodicity(this_00);
    local_1b8._0_4_ = PVar7.period.vect[0];
    local_1b8._4_4_ = PVar7.period.vect[1];
    local_1b8._8_4_ = PVar7.period.vect[2];
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              (&visc_terms->super_FabArray<amrex::FArrayBox>,0,num_comp,(Periodicity *)local_1b8,
               false);
    amrex::Extrapolater::FirstOrderExtrap
              (visc_terms,this_00,0,num_comp,
               (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  }
  if (2 < NavierStokesBase::verbose) {
    dVar6 = amrex::ParallelDescriptor::second();
    poVar3 = amrex::OutStream();
    local_1b8._0_4_ = *(int *)(DAT_00842950 + -0x30);
    this_01 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._4_4_ = *(int *)(DAT_00842950 + -0x48);
    local_1b8._8_4_ = SUB84(poVar3,0);
    local_1b8._12_4_ = (undefined4)((ulong)poVar3 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(this_01);
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
         *(undefined8 *)
          ((long)CONCAT44(local_1b8._12_4_,local_1b8._8_4_) +
          *(long *)(*(long *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"      PeleLM::getViscTerms(): lev: ",0x23);
    std::ostream::operator<<(this_01,(this->super_NavierStokesBase).super_AmrLevel.level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", time: ",8);
    std::ostream::_M_insert<double>(dVar6 - local_1c0);
    local_220._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,(char *)&local_220,1);
    amrex::Print::~Print((Print *)local_1b8);
  }
  return;
}

Assistant:

void
PeleLM::getViscTerms (MultiFab& visc_terms,
                      int       src_comp,
                      int       num_comp,
                      Real      time)
{
   BL_PROFILE("PLM::getViscTerms()");
   const Real strt_time = ParallelDescriptor::second();
   //
   // Load "viscous" terms, starting from component = 0.
   //
   // JFG: for species, this procedure returns the *negative* of the divergence of
   // of the diffusive fluxes.  specifically, in the mixture averaged case, the
   // diffusive flux vector for species k is
   //
   //       j_k = - rho D_k,mix grad Y_k
   //
   // so the divergence of the flux, div dot j_k, has a negative in it.  instead
   // this procedure returns - div dot j_k to remove the negative.
   //
   // note the fluxes used in the code are extensive, that is, scaled by the areas
   // of the cell edges.  the calculation of the divergence is the sum of un-divided
   // differences of the extensive fluxes, all divided by volume.  so the effect is
   // to give the true divided difference approximation to the divergence of the
   // intensive flux.

   const int  nGrow     = visc_terms.nGrow();
   //
   // Get Div(tau) from the tensor operator, if velocity and have non-const viscosity
   //
   visc_terms.setBndry(1.e30);
   if (src_comp < AMREX_SPACEDIM)
   {
      if (src_comp != Xvel || num_comp < AMREX_SPACEDIM)
         amrex::Error("tensor v -> getViscTerms needs all v-components at once");

      FluxBoxes fb(this);
      MultiFab** vel_visc = fb.get();
      getViscosity(vel_visc, time);

      for (int dir=0; dir<AMREX_SPACEDIM; ++dir) {
         showMF("velVT",*(vel_visc[dir]),amrex::Concatenate("velVT_viscn_",dir,1),level);
      }
      int viscComp = 0;
      const TimeLevel whichTime = which_time(State_Type,time);
      AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);
      auto vel_visc_cc = (whichTime == AmrOldTime ? viscn_cc : viscnp1_cc);
      diffusion->getTensorViscTerms(visc_terms,time,vel_visc,vel_visc_cc,viscComp);

      showMF("velVT",visc_terms,"velVT_visc_terms_1",level);
   }
   else
   {
     amrex::Abort("Should only call getViscTerms for velocity");
   }

   //
   // Ensure consistent grow cells
   //
   if (nGrow > 0)
   {
      visc_terms.FillBoundary(0,num_comp, geom.periodicity());
      Extrapolater::FirstOrderExtrap(visc_terms, geom, 0, num_comp, visc_terms.nGrow());
   }

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::getViscTerms(): lev: " << level
                     << ", time: " << run_time << '\n';
   }
}